

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O2

void __thiscall
directed_flag_complex_computer::add_cell_index_to_cache_t::operator()
          (add_cell_index_to_cache_t *this,vertex_index_t *first_vertex,int size)

{
  void *__dest;
  ulong uVar1;
  
  this->current_index = this->current_index + 1;
  uVar1 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar1 = (long)size * 2;
  }
  __dest = operator_new__(uVar1);
  if (size != 0) {
    memcpy(__dest,first_vertex,(long)size * 2);
  }
  cell_hasher_t::dimension = (short)size - 1;
  std::
  _Hashtable<directed_flag_complex_cell_t,std::pair<directed_flag_complex_cell_t_const,unsigned_long>,std::allocator<std::pair<directed_flag_complex_cell_t_const,unsigned_long>>,std::__detail::_Select1st,cell_comparer_t,cell_hasher_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<directed_flag_complex_cell_t,int>>
            ((_Hashtable<directed_flag_complex_cell_t,std::pair<directed_flag_complex_cell_t_const,unsigned_long>,std::allocator<std::pair<directed_flag_complex_cell_t_const,unsigned_long>>,std::__detail::_Select1st,cell_comparer_t,cell_hasher_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this->cache);
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size) {
		// The index starts at -1, so the first cell gets index 0
		current_index++;

		// Save the cell vertices on the heap
		vertex_index_t* c = new vertex_index_t[size];
		std::copy(first_vertex, first_vertex + size, c);

		directed_flag_complex_cell_t cell(c);
		cell_hasher_t::set_current_cell_dimension(size - 1);

		cache.insert(std::make_pair(cell, current_index));
	}